

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O1

idx_t duckdb::Contains<unsigned_int,duckdb::ContainsUnaligned>
                (uchar *haystack,idx_t haystack_size,uchar *needle,idx_t needle_size,
                idx_t base_offset)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  idx_t iVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  bool bVar9;
  
  iVar7 = 0xffffffffffffffff;
  if ((needle_size <= haystack_size) && (uVar8 = (haystack_size + 1) - needle_size, uVar8 != 0)) {
    iVar2 = *(int *)needle;
    bVar1 = *needle;
    uVar6 = 0;
    do {
      piVar3 = (int *)memchr(haystack + uVar6,(uint)bVar1,uVar8 - uVar6);
      if (piVar3 == (int *)0x0) {
        iVar7 = 0xffffffffffffffff;
        bVar9 = false;
      }
      else {
        uVar6 = (long)piVar3 - (long)haystack;
        bVar9 = true;
        if (iVar2 == *piVar3) {
          if (needle_size < 5) {
            lVar4 = 0;
          }
          else {
            iVar5 = 4;
            lVar4 = 0;
            do {
              lVar4 = lVar4 + (ulong)(*(uchar *)((long)piVar3 + iVar5) == needle[iVar5]);
              iVar5 = iVar5 + 1;
            } while (needle_size != iVar5);
          }
          bVar9 = lVar4 != needle_size - 4;
          if (!bVar9) {
            iVar7 = base_offset + uVar6;
          }
        }
      }
      if (!bVar9) {
        return iVar7;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar8);
  }
  return 0xffffffffffffffff;
}

Assistant:

static idx_t Contains(const unsigned char *haystack, idx_t haystack_size, const unsigned char *needle,
                      idx_t needle_size, idx_t base_offset) {
	if (needle_size > haystack_size) {
		// needle is bigger than haystack: haystack cannot contain needle
		return DConstants::INVALID_INDEX;
	}
	haystack_size -= needle_size - 1;
	auto needle_entry = Load<UNSIGNED>(needle);
	for (idx_t offset = 0; offset < haystack_size; offset++) {
		// start off by performing a memchr to find the first character of the
		auto location =
		    static_cast<const unsigned char *>(memchr(haystack + offset, needle[0], haystack_size - offset));
		if (!location) {
			return DConstants::INVALID_INDEX;
		}
		// for this position we first compare the haystack with the needle
		offset = UnsafeNumericCast<idx_t>(location - haystack);
		auto haystack_entry = Load<UNSIGNED>(location);
		if (needle_entry == haystack_entry) {
			if (OP::template MatchRemainder<UNSIGNED>(location, needle, needle_size)) {
				return base_offset + offset;
			}
		}
	}
	return DConstants::INVALID_INDEX;
}